

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

ObjFunction * compile(char *source)

{
  _Bool _Var1;
  ObjFunction *pOVar2;
  Compiler compiler;
  
  initScanner(source);
  initCompiler(&compiler,TYPE_SCRIPT);
  parser.hadError = false;
  parser.panicMode = false;
  advance();
  while( true ) {
    _Var1 = match(TOKEN_EOF);
    if (_Var1) break;
    declaration();
  }
  pOVar2 = endCompiler();
  if (parser.hadError != false) {
    pOVar2 = (ObjFunction *)0x0;
  }
  return pOVar2;
}

Assistant:

ObjFunction *compile(const char *source) {
    initScanner(source);
    Compiler compiler;
    initCompiler(&compiler, TYPE_SCRIPT);
    parser.hadError = false;
    parser.panicMode = false;
    advance();
    while (!match(TOKEN_EOF)) {
        declaration();
    }
    ObjFunction *function = endCompiler();
    return parser.hadError ? NULL : function;
}